

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoordCalc.cpp
# Opt level: O0

double YProbe_at_m(positionTy *posAt,XPLMProbeRef *probeRef)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  logLevelTy lVar4;
  long lVar5;
  LTError *this;
  double *pdVar6;
  undefined8 uVar7;
  long *in_RSI;
  void *in_RDI;
  XPLMProbeResult res;
  XPLMProbeInfo_t probeInfo;
  positionTy pos;
  XPLMProbeInfo_t *in_stack_fffffffffffffec8;
  positionTy *in_stack_fffffffffffffed0;
  string *psVar8;
  positionTy *in_stack_fffffffffffffef0;
  undefined1 local_108 [72];
  string local_c0 [32];
  uint local_a0;
  undefined4 local_9c [11];
  undefined1 local_70 [40];
  double local_8;
  
  if (*in_RSI == 0) {
    lVar5 = XPLMCreateProbe(0);
    *in_RSI = lVar5;
  }
  if (*in_RSI != 0) {
    memcpy(local_70,in_RDI,0x48);
    pdVar6 = positionTy::alt_m((positionTy *)local_70);
    uVar3 = std::isnan(*pdVar6);
    if ((uVar3 & 1) != 0) {
      pdVar6 = positionTy::alt_m((positionTy *)local_70);
      *pdVar6 = 0.0;
    }
    positionTy::WorldToLocal(in_stack_fffffffffffffef0);
    memset(local_9c,0,0x2c);
    local_9c[0] = 0x2c;
    lVar5 = *in_RSI;
    pdVar6 = positionTy::X((positionTy *)0x12e6a5);
    dVar1 = *pdVar6;
    pdVar6 = positionTy::Y((positionTy *)0x12e6c0);
    dVar2 = *pdVar6;
    pdVar6 = positionTy::Z((positionTy *)0x12e6db);
    local_a0 = XPLMProbeTerrainXYZ((float)dVar1,(float)dVar2,
                                   CONCAT44((int)((ulong)*pdVar6 >> 0x20),(float)*pdVar6),lVar5,
                                   local_9c);
    if (local_a0 == 0) {
      positionTy::positionTy(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      memcpy(local_70,local_108,0x48);
      positionTy::LocalToWorld(in_stack_fffffffffffffef0);
      pdVar6 = positionTy::alt_m((positionTy *)local_70);
      local_8 = *pdVar6;
    }
    else {
      lVar4 = DataRefs::GetLogLevel(&dataRefs);
      uVar3 = local_a0;
      if ((int)lVar4 < 1) {
        psVar8 = local_c0;
        positionTy::dbgTxt_abi_cxx11_((positionTy *)probeInfo._4_8_);
        uVar7 = std::__cxx11::string::c_str();
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/CoordCalc.cpp"
               ,0x115,"YProbe_at_m",logDEBUG,"Y Probe returned %d at %s",(ulong)uVar3,uVar7,psVar8);
        std::__cxx11::string::~string(local_c0);
      }
      local_8 = 0.0;
    }
    return local_8;
  }
  this = (LTError *)__cxa_allocate_exception(0x18);
  LTError::LTError(this,
                   "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/CoordCalc.cpp"
                   ,0x103,"YProbe_at_m",logFATAL,"ASSERT FAILED: %s","probeRef!=NULL");
  __cxa_throw(this,&LTError::typeinfo,LTError::~LTError);
}

Assistant:

double YProbe_at_m (const positionTy& posAt, XPLMProbeRef& probeRef)
{
    // first call, don't have handle?
    if (!probeRef)
        probeRef = XPLMCreateProbe(xplm_ProbeY);
    LOG_ASSERT(probeRef!=NULL);
    
    // works with local coordinates
    positionTy pos (posAt);
    // next call requires a valid altitude, even if it is just the altitude we want to figure out...
    if (std::isnan(pos.alt_m()))
        pos.alt_m() = 0;
    pos.WorldToLocal();
    
    // let the probe drop...
    XPLMProbeInfo_t probeInfo { sizeof(probeInfo), 0, 0, 0, 0, 0, 0, 0, 0, 0, 0 };
    XPLMProbeResult res = XPLMProbeTerrainXYZ(probeRef,
                                              (float)pos.X(),
                                              (float)pos.Y(),
                                              (float)pos.Z(),
                                              &probeInfo);
    if (res != xplm_ProbeHitTerrain)
    {
        LOG_MSG(logDEBUG,ERR_Y_PROBE,int(res),posAt.dbgTxt().c_str());
        return 0.0;                 // assume water
    }
    
    // convert to World coordinates and save terrain altitude [in ft]
    pos = positionTy(probeInfo);
    pos.LocalToWorld();
    return pos.alt_m();             // THIS is terrain altitude beneath posAt
}